

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

void Abc_AigFree(Abc_Aig_t *pMan)

{
  int iVar1;
  Abc_Aig_t *pMan_local;
  
  iVar1 = Vec_PtrSize(pMan->vStackReplaceOld);
  if (iVar1 != 0) {
    __assert_fail("Vec_PtrSize( pMan->vStackReplaceOld ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0xa7,"void Abc_AigFree(Abc_Aig_t *)");
  }
  iVar1 = Vec_PtrSize(pMan->vStackReplaceNew);
  if (iVar1 != 0) {
    __assert_fail("Vec_PtrSize( pMan->vStackReplaceNew ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0xa8,"void Abc_AigFree(Abc_Aig_t *)");
  }
  if (pMan->vAddedCells != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(pMan->vAddedCells);
  }
  if (pMan->vUpdatedNets != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(pMan->vUpdatedNets);
  }
  Vec_VecFree(pMan->vLevels);
  Vec_VecFree(pMan->vLevelsR);
  Vec_PtrFree(pMan->vStackReplaceOld);
  Vec_PtrFree(pMan->vStackReplaceNew);
  Vec_PtrFree(pMan->vNodes);
  if (pMan->pBins != (Abc_Obj_t **)0x0) {
    free(pMan->pBins);
    pMan->pBins = (Abc_Obj_t **)0x0;
  }
  if (pMan != (Abc_Aig_t *)0x0) {
    free(pMan);
  }
  return;
}

Assistant:

void Abc_AigFree( Abc_Aig_t * pMan )
{
    assert( Vec_PtrSize( pMan->vStackReplaceOld ) == 0 );
    assert( Vec_PtrSize( pMan->vStackReplaceNew ) == 0 );
    // free the table
    if ( pMan->vAddedCells )
        Vec_PtrFree( pMan->vAddedCells );
    if ( pMan->vUpdatedNets )
        Vec_PtrFree( pMan->vUpdatedNets );
    Vec_VecFree( pMan->vLevels );
    Vec_VecFree( pMan->vLevelsR );
    Vec_PtrFree( pMan->vStackReplaceOld );
    Vec_PtrFree( pMan->vStackReplaceNew );
    Vec_PtrFree( pMan->vNodes );
    ABC_FREE( pMan->pBins );
    ABC_FREE( pMan );
}